

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void flatbuffers::SetString
               (Schema *schema,string *val,String *str,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  String SVar1;
  uint start;
  pointer puVar2;
  ulong uVar3;
  size_type sVar4;
  ResizeContext ctx;
  ResizeContext local_68;
  
  sVar4 = val->_M_string_length;
  SVar1 = *str;
  puVar2 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)str - (long)puVar2;
  start = (int)uVar3 + 4;
  if (SUB84(sVar4,0) != SVar1) {
    memset(puVar2 + start,0,(ulong)(uint)SVar1);
    ResizeContext::ResizeContext
              (&local_68,schema,start,(int)SUB84(sVar4,0) - (int)SVar1,flatbuf,root_table);
    puVar2 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = val->_M_string_length;
    *(int *)(puVar2 + (uVar3 & 0xffffffff)) = (int)sVar4;
    if (local_68.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.dag_check_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.dag_check_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.dag_check_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      puVar2 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = val->_M_string_length;
    }
  }
  memcpy(puVar2 + start,(val->_M_dataplus)._M_p,sVar4 + 1);
  return;
}

Assistant:

void SetString(const reflection::Schema &schema, const std::string &val,
               const String *str, std::vector<uint8_t> *flatbuf,
               const reflection::Object *root_table) {
  auto delta = static_cast<int>(val.size()) - static_cast<int>(str->size());
  auto str_start = static_cast<uoffset_t>(
      reinterpret_cast<const uint8_t *>(str) - flatbuf->data());
  auto start = str_start + static_cast<uoffset_t>(sizeof(uoffset_t));
  if (delta) {
    // Clear the old string, since we don't want parts of it remaining.
    memset(flatbuf->data() + start, 0, str->size());
    // Different size, we must expand (or contract).
    ResizeContext ctx(schema, start, delta, flatbuf, root_table);
    // Set the new length.
    WriteScalar(flatbuf->data() + str_start,
                static_cast<uoffset_t>(val.size()));
  }
  // Copy new data. Safe because we created the right amount of space.
  memcpy(flatbuf->data() + start, val.c_str(), val.size() + 1);
}